

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

int __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Skip
          (CopyingFileInputStream *this,int count)

{
  __off_t _Var1;
  int in_ESI;
  LogMessage *in_RDI;
  int in_stack_00000fa4;
  CopyingInputStream *in_stack_00000fa8;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff88;
  LogMessage local_50;
  int local_14;
  int local_4;
  
  local_14 = in_ESI;
  if (((ulong)in_RDI->filename_ & 0x10000000000) != 0) {
    this_00 = &local_50;
    internal::LogMessage::LogMessage
              (in_RDI,(LogLevel_conflict)((ulong)in_stack_ffffffffffffff88 >> 0x20),(char *)this_00,
               in_stack_ffffffffffffff7c);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    internal::LogMessage::~LogMessage((LogMessage *)0x3ebf2b);
  }
  if (((in_RDI->field_0x14 & 1) == 0) &&
     (_Var1 = lseek(*(int *)&in_RDI->filename_,(long)local_14,1), _Var1 != -1)) {
    local_4 = local_14;
  }
  else {
    in_RDI->field_0x14 = 1;
    local_4 = CopyingInputStream::Skip(in_stack_00000fa8,in_stack_00000fa4);
  }
  return local_4;
}

Assistant:

int FileInputStream::CopyingFileInputStream::Skip(int count) {
  GOOGLE_CHECK(!is_closed_);

  if (!previous_seek_failed_ && lseek(file_, count, SEEK_CUR) != (off_t)-1) {
    // Seek succeeded.
    return count;
  } else {
    // Failed to seek.

    // Note to self:  Don't seek again.  This file descriptor doesn't
    // support it.
    previous_seek_failed_ = true;

    // Use the default implementation.
    return CopyingInputStream::Skip(count);
  }
}